

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O1

void __thiscall vox::VoxWriter::PrintStats(VoxWriter *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  pointer pVVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  mapped_type_conflict *pmVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  VoxCube *cube;
  pointer pVVar12;
  bool bVar13;
  map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  frame_counts;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  local_60;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---- Stats ------------------------------",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Volume : ",9);
  poVar4 = std::ostream::_M_insert<double>
                     ((this->maxVolume).upperBound.x - (this->maxVolume).lowerBound.x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," x ",3);
  poVar4 = std::ostream::_M_insert<double>
                     ((this->maxVolume).upperBound.y - (this->maxVolume).lowerBound.y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," x ",3);
  poVar4 = std::ostream::_M_insert<double>
                     ((this->maxVolume).upperBound.z - (this->maxVolume).lowerBound.z);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"count cubes : ",0xe);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pVVar12 = (this->cubes).super__Vector_base<vox::VoxCube,_std::allocator<vox::VoxCube>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar3 = (this->cubes).super__Vector_base<vox::VoxCube,_std::allocator<vox::VoxCube>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pVVar12 != pVVar3) {
    do {
      for (p_Var6 = (pVVar12->xyzis)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(pVVar12->xyzis)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        iVar2 = *(int *)&p_Var6[1]._M_parent;
        pmVar5 = std::
                 map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                 ::operator[]((map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                               *)&local_60,&p_Var6[1]._M_color);
        *pmVar5 = *pmVar5 + (long)iVar2;
      }
      pVVar12 = pVVar12 + 1;
    } while (pVVar12 != pVVar3);
  }
  if (1 < local_60._M_impl.super__Rb_tree_header._M_node_count) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"count key frames : ",0x13);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-----------------------------------------",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      p_Var1 = &(this->m_FrameTimes)._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," o--\\-> key frame : ",0x14);
        p_Var6 = p_Var9 + 1;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"     \\-> voxels count : ",0x18);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        p_Var10 = (this->m_FrameTimes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = &p_Var1->_M_header;
        if (p_Var10 != (_Base_ptr)0x0) {
          do {
            bVar13 = (_Rb_tree_color)*(size_t *)(p_Var10 + 1) < p_Var6->_M_color;
            if (!bVar13) {
              p_Var7 = p_Var10;
            }
            p_Var10 = (&p_Var10->_M_left)[bVar13];
          } while (p_Var10 != (_Base_ptr)0x0);
        }
        p_Var11 = p_Var1;
        if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
           (p_Var11 = (_Rb_tree_header *)p_Var7,
           p_Var6->_M_color < (_Rb_tree_color)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
          p_Var11 = p_Var1;
        }
        if (p_Var11 != p_Var1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"      \\-> elapsed time : ",0x19);
          pmVar8 = std::
                   map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                   ::at(&this->m_FrameTimes,&p_Var6->_M_color);
          poVar4 = std::ostream::_M_insert<double>(*pmVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," secs",5);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != &local_60._M_impl.super__Rb_tree_header);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-----------------------------------------",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"voxels total : ",0xf);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"total elapsed time : ",0x15);
  poVar4 = std::ostream::_M_insert<double>(this->m_TotalTime);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," secs",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------------------",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void VoxWriter::PrintStats() const {
    std::cout << "---- Stats ------------------------------" << std::endl;
    std::cout << "Volume : " << maxVolume.Size().x << " x " << maxVolume.Size().y << " x " << maxVolume.Size().z << std::endl;
    std::cout << "count cubes : " << cubes.size() << std::endl;
    std::map<KeyFrame, size_t> frame_counts;
    for (const auto& cube : cubes) {
        for (auto& key_xyzi : cube.xyzis) {
            frame_counts[key_xyzi.first] += key_xyzi.second.numVoxels;
        }
    }
    size_t voxels_total = 0U;
    if (frame_counts.size() > 1U) {
        std::cout << "count key frames : " << frame_counts.size() << std::endl;
        std::cout << "-----------------------------------------" << std::endl;
        for (const auto& frame_count : frame_counts) {
            std::cout << " o--\\-> key frame : " << frame_count.first << std::endl;
            std::cout << "     \\-> voxels count : " << frame_count.second << std::endl;
            if (m_FrameTimes.find(frame_count.first) != m_FrameTimes.end()) {
                std::cout << "      \\-> elapsed time : " << m_FrameTimes.at(frame_count.first) << " secs" << std::endl;
            }
            voxels_total += frame_count.second;
        }
        std::cout << "-----------------------------------------" << std::endl;
    } else if (!frame_counts.empty()) {
        voxels_total = frame_counts.begin()->second;
    }
    std::cout << "voxels total : " << voxels_total << std::endl;
    std::cout << "total elapsed time : " << m_TotalTime << " secs" << std::endl;
    std::cout << "-----------------------------------------" << std::endl;
}